

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_ssse3_intr.c
# Opt level: O0

void ihevc_intra_pred_luma_dc_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  short sVar18;
  int iVar19;
  int iVar20;
  undefined8 *puVar21;
  int in_ECX;
  undefined8 *in_RDX;
  long in_RDI;
  int in_R8D;
  ushort uVar22;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  __m128i src_temp2;
  __m128i src_temp10;
  __m128i src_temp8;
  __m128i src_temp6;
  __m128i src_temp5;
  __m128i src_temp4;
  __m128i src_temp3;
  __m128i src_temp7;
  __m128i src_temp1;
  WORD32 three_nt;
  WORD32 two_nt;
  WORD32 log2nt;
  WORD32 row;
  WORD32 three_dc_val;
  WORD32 two_dc_val;
  WORD32 dc_val;
  WORD32 acc_dc;
  int local_10cc;
  undefined8 local_1098;
  undefined8 uStack_1090;
  ushort local_1088;
  ushort uStack_1080;
  undefined1 local_1048 [10];
  short sStack_103e;
  short sStack_103c;
  short sStack_103a;
  char local_ff4;
  int local_ff0;
  undefined1 local_fe4;
  undefined8 *local_fd0;
  byte bStack_937;
  byte bStack_936;
  byte bStack_935;
  byte bStack_934;
  byte bStack_933;
  byte bStack_932;
  byte bStack_931;
  byte local_918;
  byte bStack_917;
  byte bStack_916;
  byte bStack_915;
  byte bStack_914;
  byte bStack_913;
  byte bStack_912;
  byte bStack_911;
  byte local_8f8;
  byte bStack_8f7;
  byte bStack_8f6;
  byte bStack_8f5;
  byte bStack_8f4;
  byte bStack_8f3;
  byte bStack_8f2;
  byte bStack_8f1;
  byte local_8d8;
  byte bStack_8d7;
  byte bStack_8d6;
  byte bStack_8d5;
  byte bStack_8d4;
  byte bStack_8d3;
  byte bStack_8d2;
  byte bStack_8d1;
  byte local_8b8;
  undefined1 uStack_8b7;
  undefined1 uStack_8b6;
  undefined1 uStack_8b5;
  undefined1 uStack_8b4;
  undefined1 uStack_8b3;
  undefined1 uStack_8b2;
  undefined1 uStack_8b1;
  ushort uStack_896;
  ushort uStack_894;
  ushort uStack_892;
  ushort uStack_88e;
  ushort uStack_88c;
  ushort uStack_88a;
  ushort uStack_876;
  ushort uStack_874;
  ushort uStack_872;
  ushort uStack_870;
  ushort uStack_86e;
  ushort uStack_86c;
  ushort uStack_86a;
  short local_868;
  short sStack_866;
  short sStack_864;
  short sStack_862;
  short sStack_860;
  short sStack_85e;
  short sStack_85c;
  short sStack_85a;
  short local_858;
  short sStack_856;
  short sStack_854;
  short sStack_852;
  short sStack_850;
  short sStack_84e;
  short sStack_84c;
  short sStack_84a;
  ushort uStack_836;
  ushort uStack_834;
  ushort uStack_832;
  ushort uStack_830;
  ushort uStack_82e;
  ushort uStack_82c;
  ushort uStack_82a;
  ushort uStack_816;
  ushort uStack_814;
  ushort uStack_812;
  ushort uStack_810;
  ushort uStack_80e;
  ushort uStack_80c;
  ushort uStack_80a;
  short local_7e8;
  short sStack_7e6;
  short sStack_7e4;
  short sStack_7e2;
  short sStack_7e0;
  short sStack_7de;
  short sStack_7dc;
  short sStack_7da;
  short local_7d8;
  short sStack_7d6;
  short sStack_7d4;
  short sStack_7d2;
  short sStack_7d0;
  short sStack_7ce;
  short sStack_7cc;
  short sStack_7ca;
  short local_7c8;
  short sStack_7c6;
  short sStack_7c4;
  short sStack_7c2;
  short sStack_7c0;
  short sStack_7be;
  short sStack_7bc;
  short sStack_7ba;
  short local_7b8;
  short sStack_7b6;
  short sStack_7b4;
  short sStack_7b2;
  short sStack_7b0;
  short sStack_7ae;
  short sStack_7ac;
  short sStack_7aa;
  int local_558;
  int local_538;
  undefined4 local_518;
  undefined4 local_4f8;
  undefined4 local_4d8;
  int local_498;
  int local_478;
  undefined1 local_1d8 [8];
  undefined1 local_1d0 [24];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [8];
  undefined1 local_d0 [24];
  undefined1 local_b8 [8];
  undefined1 local_b0 [24];
  undefined1 local_98 [8];
  undefined1 local_90 [24];
  undefined1 local_78 [8];
  undefined1 local_70 [20];
  WORD32 temp3;
  WORD32 temp2;
  WORD32 temp1;
  __m128i sm1;
  undefined1 local_38 [4];
  WORD32 itr_count;
  __m128i temp;
  __m128i sm;
  __m128i m_zero;
  
  local_ff4 = '\x05';
  switch(in_R8D) {
  case 4:
    local_ff4 = '\x02';
    break;
  default:
    break;
  case 8:
    local_ff4 = '\x03';
    break;
  case 0x10:
    local_ff4 = '\x04';
    break;
  case 0x20:
    local_ff4 = '\x05';
  }
  iVar19 = in_R8D * 2;
  iVar20 = in_R8D * 3;
  if (in_R8D == 0x20) {
    auVar23 = psadbw(*(undefined1 (*) [16])(in_RDI + 0x20),ZEXT816(0));
    auVar24 = psadbw(*(undefined1 (*) [16])(in_RDI + 0x30),ZEXT816(0));
    auVar25 = psadbw(*(undefined1 (*) [16])(in_RDI + 0x40),ZEXT816(0));
    auVar26 = psadbw(*(undefined1 (*) [16])(in_RDI + 0x50),ZEXT816(0));
    local_7b8 = auVar23._0_2_;
    sStack_7b6 = auVar23._2_2_;
    sStack_7b4 = auVar23._4_2_;
    sStack_7b2 = auVar23._6_2_;
    sStack_7b0 = auVar23._8_2_;
    sStack_7ae = auVar23._10_2_;
    sStack_7ac = auVar23._12_2_;
    sStack_7aa = auVar23._14_2_;
    local_7c8 = auVar24._0_2_;
    sStack_7c6 = auVar24._2_2_;
    sStack_7c4 = auVar24._4_2_;
    sStack_7c2 = auVar24._6_2_;
    sStack_7c0 = auVar24._8_2_;
    sStack_7be = auVar24._10_2_;
    sStack_7bc = auVar24._12_2_;
    sStack_7ba = auVar24._14_2_;
    local_7d8 = auVar25._0_2_;
    sStack_7d6 = auVar25._2_2_;
    sStack_7d4 = auVar25._4_2_;
    sStack_7d2 = auVar25._6_2_;
    sStack_7d0 = auVar25._8_2_;
    sStack_7ce = auVar25._10_2_;
    sStack_7cc = auVar25._12_2_;
    sStack_7ca = auVar25._14_2_;
    local_7e8 = auVar26._0_2_;
    sStack_7e6 = auVar26._2_2_;
    sStack_7e4 = auVar26._4_2_;
    sStack_7e2 = auVar26._6_2_;
    sStack_7e0 = auVar26._8_2_;
    sStack_7de = auVar26._10_2_;
    sStack_7dc = auVar26._12_2_;
    sStack_7da = auVar26._14_2_;
    local_1048._2_2_ = sStack_7b6 + sStack_7c6 + sStack_7d6 + sStack_7e6;
    local_1048._0_2_ = local_7b8 + local_7c8 + local_7d8 + local_7e8;
    local_1048._4_2_ = sStack_7b4 + sStack_7c4 + sStack_7d4 + sStack_7e4;
    local_1048._6_2_ = sStack_7b2 + sStack_7c2 + sStack_7d2 + sStack_7e2;
    local_1048._8_2_ = sStack_7b0 + sStack_7c0 + sStack_7d0 + sStack_7e0;
    sStack_103e = sStack_7ae + sStack_7be + sStack_7ce + sStack_7de;
    sStack_103c = sStack_7ac + sStack_7bc + sStack_7cc + sStack_7dc;
    sStack_103a = sStack_7aa + sStack_7ba + sStack_7ca + sStack_7da;
    auVar16._8_8_ = stack0xffffffffffffefc0;
    auVar16._0_8_ = local_1048._0_8_;
    auVar15[8] = '\x0f';
    auVar15[9] = '\x0f';
    auVar15[10] = '\x0f';
    auVar15[0xb] = '\x0f';
    auVar15[0xc] = '\x0f';
    auVar15[0xd] = '\x0f';
    auVar15[0xe] = '\x0f';
    auVar15[0xf] = '\x0f';
    auVar15[0] = '\0';
    auVar15[1] = '\x01';
    auVar15[2] = '\b';
    auVar15[3] = '\t';
    auVar15[4] = '\x0f';
    auVar15[5] = '\x0f';
    auVar15[6] = '\x0f';
    auVar15[7] = '\x0f';
    auVar23 = pshufb(auVar16,auVar15);
    auVar23 = phaddw(auVar23,ZEXT816(0));
    local_478 = auVar23._0_4_;
    local_fe4 = (undefined1)
                ((int)(((local_478 + (uint)*(byte *)(in_RDI + iVar20)) -
                       (uint)*(byte *)(in_RDI + iVar19)) + 0x20) >> local_ff4 + 1);
    local_1d0._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    local_1d8._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    uVar1 = CONCAT17(local_fe4,
                     CONCAT16(local_fe4,
                              CONCAT15(local_fe4,
                                       CONCAT14(local_fe4,CONCAT13(local_fe4,local_1d8._0_3_)))));
    uVar7 = CONCAT17(local_fe4,
                     CONCAT16(local_fe4,
                              CONCAT15(local_fe4,
                                       CONCAT14(local_fe4,CONCAT13(local_fe4,local_1d0._0_3_)))));
    local_fd0 = in_RDX;
    for (local_10cc = 0; local_10cc < 2; local_10cc = local_10cc + 1) {
      *local_fd0 = uVar1;
      local_fd0[1] = uVar7;
      *(undefined8 *)((long)local_fd0 + (long)in_ECX) = uVar1;
      ((undefined8 *)((long)local_fd0 + (long)in_ECX))[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX << 1));
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 3));
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX << 2));
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 5));
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 6));
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 7));
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX << 3));
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 9));
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 10));
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 0xb));
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 0xc));
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 0xd));
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 0xe));
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 0xf));
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      local_fd0[2] = uVar1;
      local_fd0[3] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)in_ECX + 0x10);
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX << 1) + 0x10);
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 3) + 0x10);
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX << 2) + 0x10);
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 5) + 0x10);
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 6) + 0x10);
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 7) + 0x10);
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX << 3) + 0x10);
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 9) + 0x10);
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 10) + 0x10);
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 0xb) + 0x10);
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 0xc) + 0x10);
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 0xd) + 0x10);
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 0xe) + 0x10);
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      puVar21 = (undefined8 *)((long)local_fd0 + (long)(in_ECX * 0xf) + 0x10);
      *puVar21 = uVar1;
      puVar21[1] = uVar7;
      local_fd0 = (undefined8 *)((long)local_fd0 + (long)(in_ECX << 4));
    }
  }
  else if (in_R8D == 4) {
    uVar1 = *(undefined8 *)(in_RDI + 4);
    uVar7 = *(undefined8 *)(in_RDI + 1 + (long)iVar19);
    local_8b8 = (byte)uVar1;
    uStack_8b7 = (undefined1)((ulong)uVar1 >> 8);
    uStack_8b6 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_8b5 = (undefined1)((ulong)uVar1 >> 0x18);
    uStack_8b4 = (undefined1)((ulong)uVar1 >> 0x20);
    uStack_8b3 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_8b2 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_8b1 = (undefined1)((ulong)uVar1 >> 0x38);
    local_1048[1] = 0;
    local_1048[0] = local_8b8;
    local_1048[2] = uStack_8b7;
    local_1048[3] = 0;
    local_1048[4] = uStack_8b6;
    local_1048[5] = 0;
    local_1048[6] = uStack_8b5;
    local_1048[7] = 0;
    local_1048[8] = uStack_8b4;
    local_1048[9] = 0;
    sStack_103e._0_1_ = uStack_8b3;
    sStack_103e._1_1_ = 0;
    sStack_103c._0_1_ = uStack_8b2;
    sStack_103c._1_1_ = 0;
    sStack_103a._0_1_ = uStack_8b1;
    local_8d8 = (byte)uVar7;
    bStack_8d7 = (byte)((ulong)uVar7 >> 8);
    bStack_8d6 = (byte)((ulong)uVar7 >> 0x10);
    bStack_8d5 = (byte)((ulong)uVar7 >> 0x18);
    bStack_8d4 = (byte)((ulong)uVar7 >> 0x20);
    bStack_8d3 = (byte)((ulong)uVar7 >> 0x28);
    bStack_8d2 = (byte)((ulong)uVar7 >> 0x30);
    bStack_8d1 = (byte)((ulong)uVar7 >> 0x38);
    local_1098._0_2_ = (ushort)local_8d8;
    auVar17._8_7_ = local_1048._8_7_;
    auVar17._0_8_ = local_1048._0_8_;
    auVar17[0xf] = 0;
    auVar23 = phaddw(auVar17,ZEXT816(0));
    auVar23 = phaddw(auVar23,ZEXT816(0));
    auVar23 = phaddw(auVar23,ZEXT816(0));
    local_498 = auVar23._0_4_;
    iVar20 = (int)(((local_498 + (uint)*(byte *)(in_RDI + iVar20)) -
                   (uint)*(byte *)(in_RDI + iVar19)) + 4) >> local_ff4 + 1;
    sVar18 = (short)(iVar20 * 3) + 2;
    uStack_816 = (ushort)bStack_8d7;
    uStack_814 = (ushort)bStack_8d6;
    uStack_812 = (ushort)bStack_8d5;
    uStack_810 = (ushort)bStack_8d4;
    uStack_80e = (ushort)bStack_8d3;
    uStack_80c = (ushort)bStack_8d2;
    uStack_80a = (ushort)bStack_8d1;
    uVar22 = (ushort)((ushort)local_1098 + sVar18) >> 2;
    uVar27 = (ushort)(uStack_816 + sVar18) >> 2;
    uVar28 = (ushort)(uStack_814 + sVar18) >> 2;
    uVar29 = (ushort)(uStack_812 + sVar18) >> 2;
    uVar30 = (ushort)(uStack_810 + sVar18) >> 2;
    uVar33 = (ushort)(uStack_80e + sVar18) >> 2;
    uVar36 = (ushort)(uStack_80c + sVar18) >> 2;
    uVar39 = (ushort)(uStack_80a + sVar18) >> 2;
    local_1098._0_2_ =
         CONCAT11((uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27),
                  (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22));
    local_1098._0_3_ =
         CONCAT12((uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28),
                  (ushort)local_1098);
    local_1098._0_4_ =
         CONCAT13((uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29),
                  (undefined3)local_1098);
    local_1098._0_5_ =
         CONCAT14((uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30),
                  (undefined4)local_1098);
    local_1098._0_6_ =
         CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33),
                  (undefined5)local_1098);
    local_1098._0_7_ =
         CONCAT16((uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36),
                  (undefined6)local_1098);
    local_1098 = CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39),
                          (undefined7)local_1098);
    *(undefined4 *)in_RDX = (undefined4)local_1098;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_1098 & 0xffffffffffff0000 | (ulong)(ushort)iVar20;
    auVar23 = pshufb(auVar26,ZEXT816((ulong)0));
    auVar24 = pshufb(auVar23,ZEXT816((ulong)0));
    auVar25 = pshufb(auVar23,ZEXT816((ulong)0));
    local_4d8 = auVar23._0_4_;
    local_4f8 = auVar24._0_4_;
    local_518 = auVar25._0_4_;
    *(undefined4 *)((long)in_RDX + (long)in_ECX) = local_4d8;
    *(undefined4 *)((long)in_RDX + (long)(in_ECX << 1)) = local_4f8;
    *(undefined4 *)((long)in_RDX + (long)(in_ECX * 3)) = local_518;
    *(char *)in_RDX =
         (char)((int)((uint)*(byte *)(in_RDI + (iVar19 + -1)) + iVar20 * 2 +
                      (uint)*(byte *)(in_RDI + (iVar19 + 1)) + 2) >> 2);
    for (local_ff0 = 1; local_ff0 < 4; local_ff0 = local_ff0 + 1) {
      *(char *)((long)in_RDX + (long)(local_ff0 * in_ECX)) =
           (char)((int)((uint)*(byte *)(in_RDI + ((iVar19 + -1) - local_ff0)) + iVar20 * 3 + 2) >> 2
                 );
    }
  }
  else if (in_R8D == 8) {
    auVar23 = psadbw(*(undefined1 (*) [16])(in_RDI + 8),ZEXT816(0));
    auVar25[8] = '\x0f';
    auVar25[9] = '\x0f';
    auVar25[10] = '\x0f';
    auVar25[0xb] = '\x0f';
    auVar25[0xc] = '\x0f';
    auVar25[0xd] = '\x0f';
    auVar25[0xe] = '\x0f';
    auVar25[0xf] = '\x0f';
    auVar25[0] = '\0';
    auVar25[1] = '\x01';
    auVar25[2] = '\b';
    auVar25[3] = '\t';
    auVar25[4] = '\x0f';
    auVar25[5] = '\x0f';
    auVar25[6] = '\x0f';
    auVar25[7] = '\x0f';
    auVar23 = pshufb(auVar23,auVar25);
    auVar23 = phaddw(auVar23,ZEXT816(0));
    local_538 = auVar23._0_4_;
    iVar20 = (int)(((local_538 + (uint)*(byte *)(in_RDI + iVar20)) -
                   (uint)*(byte *)(in_RDI + iVar19)) + 8) >> local_ff4 + 1;
    sVar18 = (short)(iVar20 * 3) + 2;
    uVar1 = *(undefined8 *)(in_RDI + 1 + (long)iVar19);
    local_8f8 = (byte)uVar1;
    bStack_8f7 = (byte)((ulong)uVar1 >> 8);
    bStack_8f6 = (byte)((ulong)uVar1 >> 0x10);
    bStack_8f5 = (byte)((ulong)uVar1 >> 0x18);
    bStack_8f4 = (byte)((ulong)uVar1 >> 0x20);
    bStack_8f3 = (byte)((ulong)uVar1 >> 0x28);
    bStack_8f2 = (byte)((ulong)uVar1 >> 0x30);
    bStack_8f1 = (byte)((ulong)uVar1 >> 0x38);
    local_1098._0_2_ = (ushort)local_8f8;
    uStack_836 = (ushort)bStack_8f7;
    uStack_834 = (ushort)bStack_8f6;
    uStack_832 = (ushort)bStack_8f5;
    uStack_830 = (ushort)bStack_8f4;
    uStack_82e = (ushort)bStack_8f3;
    uStack_82c = (ushort)bStack_8f2;
    uStack_82a = (ushort)bStack_8f1;
    uVar22 = (ushort)((ushort)local_1098 + sVar18) >> 2;
    uVar27 = (ushort)(uStack_836 + sVar18) >> 2;
    uVar28 = (ushort)(uStack_834 + sVar18) >> 2;
    uVar29 = (ushort)(uStack_832 + sVar18) >> 2;
    uVar30 = (ushort)(uStack_830 + sVar18) >> 2;
    uVar33 = (ushort)(uStack_82e + sVar18) >> 2;
    uVar36 = (ushort)(uStack_82c + sVar18) >> 2;
    uVar39 = (ushort)(uStack_82a + sVar18) >> 2;
    local_1098._0_2_ =
         CONCAT11((uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27),
                  (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22));
    local_1098._0_3_ =
         CONCAT12((uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28),
                  (ushort)local_1098);
    local_1098._0_4_ =
         CONCAT13((uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29),
                  (undefined3)local_1098);
    local_1098._0_5_ =
         CONCAT14((uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30),
                  (undefined4)local_1098);
    local_1098._0_6_ =
         CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33),
                  (undefined5)local_1098);
    local_1098._0_7_ =
         CONCAT16((uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36),
                  (undefined6)local_1098);
    local_1098 = CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39),
                          (undefined7)local_1098);
    *in_RDX = local_1098;
    local_fe4 = (undefined1)iVar20;
    local_1b8._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    local_198._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    local_178._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    local_158._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    local_138._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    local_118._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    local_f8._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    *(ulong *)((long)in_RDX + (long)in_ECX) =
         CONCAT17(local_fe4,
                  CONCAT16(local_fe4,
                           CONCAT15(local_fe4,
                                    CONCAT14(local_fe4,CONCAT13(local_fe4,local_1b8._0_3_)))));
    *(ulong *)((long)in_RDX + (long)(in_ECX * 2)) =
         CONCAT17(local_fe4,
                  CONCAT16(local_fe4,
                           CONCAT15(local_fe4,
                                    CONCAT14(local_fe4,CONCAT13(local_fe4,local_198._0_3_)))));
    *(ulong *)((long)in_RDX + (long)(in_ECX * 3)) =
         CONCAT17(local_fe4,
                  CONCAT16(local_fe4,
                           CONCAT15(local_fe4,
                                    CONCAT14(local_fe4,CONCAT13(local_fe4,local_178._0_3_)))));
    *(ulong *)((long)in_RDX + (long)(in_ECX << 2)) =
         CONCAT17(local_fe4,
                  CONCAT16(local_fe4,
                           CONCAT15(local_fe4,
                                    CONCAT14(local_fe4,CONCAT13(local_fe4,local_158._0_3_)))));
    *(ulong *)((long)in_RDX + (long)(in_ECX * 5)) =
         CONCAT17(local_fe4,
                  CONCAT16(local_fe4,
                           CONCAT15(local_fe4,
                                    CONCAT14(local_fe4,CONCAT13(local_fe4,local_138._0_3_)))));
    *(ulong *)((long)in_RDX + (long)(in_ECX * 6)) =
         CONCAT17(local_fe4,
                  CONCAT16(local_fe4,
                           CONCAT15(local_fe4,
                                    CONCAT14(local_fe4,CONCAT13(local_fe4,local_118._0_3_)))));
    *(ulong *)((long)in_RDX + (long)(in_ECX * 7)) =
         CONCAT17(local_fe4,
                  CONCAT16(local_fe4,
                           CONCAT15(local_fe4,CONCAT14(local_fe4,CONCAT13(local_fe4,local_f8._0_3_))
                                   )));
    *(char *)in_RDX =
         (char)((int)((uint)*(byte *)(in_RDI + (iVar19 + -1)) + iVar20 * 2 +
                      (uint)*(byte *)(in_RDI + (iVar19 + 1)) + 2) >> 2);
    for (local_ff0 = 1; local_ff0 < 8; local_ff0 = local_ff0 + 1) {
      *(char *)((long)in_RDX + (long)(local_ff0 * in_ECX)) =
           (char)((int)((uint)*(byte *)(in_RDI + ((iVar19 + -1) - local_ff0)) + iVar20 * 3 + 2) >> 2
                 );
    }
  }
  else {
    uVar1 = *(undefined8 *)(in_RDI + 1 + (long)iVar19);
    uVar7 = *(undefined8 *)(in_RDI + 9 + (long)iVar19);
    auVar23 = psadbw(*(undefined1 (*) [16])(in_RDI + in_R8D),ZEXT816(0));
    auVar24 = psadbw(*(undefined1 (*) [16])(in_RDI + 0x10 + (long)in_R8D),ZEXT816(0));
    local_918 = (byte)uVar1;
    bStack_917 = (byte)((ulong)uVar1 >> 8);
    bStack_916 = (byte)((ulong)uVar1 >> 0x10);
    bStack_915 = (byte)((ulong)uVar1 >> 0x18);
    bStack_914 = (byte)((ulong)uVar1 >> 0x20);
    bStack_913 = (byte)((ulong)uVar1 >> 0x28);
    bStack_912 = (byte)((ulong)uVar1 >> 0x30);
    bStack_911 = (byte)((ulong)uVar1 >> 0x38);
    local_1098._0_2_ = (ushort)local_918;
    bStack_937 = (byte)((ulong)uVar7 >> 8);
    bStack_936 = (byte)((ulong)uVar7 >> 0x10);
    bStack_935 = (byte)((ulong)uVar7 >> 0x18);
    bStack_934 = (byte)((ulong)uVar7 >> 0x20);
    bStack_933 = (byte)((ulong)uVar7 >> 0x28);
    bStack_932 = (byte)((ulong)uVar7 >> 0x30);
    bStack_931 = (byte)((ulong)uVar7 >> 0x38);
    local_1088 = (ushort)(byte)uVar7;
    uStack_1080 = (ushort)bStack_934;
    local_858 = auVar23._0_2_;
    sStack_856 = auVar23._2_2_;
    sStack_854 = auVar23._4_2_;
    sStack_852 = auVar23._6_2_;
    sStack_850 = auVar23._8_2_;
    sStack_84e = auVar23._10_2_;
    sStack_84c = auVar23._12_2_;
    sStack_84a = auVar23._14_2_;
    local_868 = auVar24._0_2_;
    sStack_866 = auVar24._2_2_;
    sStack_864 = auVar24._4_2_;
    sStack_862 = auVar24._6_2_;
    sStack_860 = auVar24._8_2_;
    sStack_85e = auVar24._10_2_;
    sStack_85c = auVar24._12_2_;
    sStack_85a = auVar24._14_2_;
    local_1048._2_2_ = sStack_856 + sStack_866;
    local_1048._0_2_ = local_858 + local_868;
    local_1048._4_2_ = sStack_854 + sStack_864;
    local_1048._6_2_ = sStack_852 + sStack_862;
    local_1048._8_2_ = sStack_850 + sStack_860;
    sStack_103e = sStack_84e + sStack_85e;
    sStack_103c = sStack_84c + sStack_85c;
    sStack_103a = sStack_84a + sStack_85a;
    auVar24._8_8_ = stack0xffffffffffffefc0;
    auVar24._0_8_ = local_1048._0_8_;
    auVar23[8] = '\x0f';
    auVar23[9] = '\x0f';
    auVar23[10] = '\x0f';
    auVar23[0xb] = '\x0f';
    auVar23[0xc] = '\x0f';
    auVar23[0xd] = '\x0f';
    auVar23[0xe] = '\x0f';
    auVar23[0xf] = '\x0f';
    auVar23[0] = '\0';
    auVar23[1] = '\x01';
    auVar23[2] = '\b';
    auVar23[3] = '\t';
    auVar23[4] = '\x0f';
    auVar23[5] = '\x0f';
    auVar23[6] = '\x0f';
    auVar23[7] = '\x0f';
    auVar23 = pshufb(auVar24,auVar23);
    auVar23 = phaddw(auVar23,ZEXT816(0));
    local_558 = auVar23._0_4_;
    iVar20 = (int)(((local_558 + (uint)*(byte *)(in_RDI + iVar20)) -
                   (uint)*(byte *)(in_RDI + iVar19)) + in_R8D) >> local_ff4 + 1;
    sVar18 = (short)(iVar20 * 3) + 2;
    uStack_876 = (ushort)bStack_917;
    uStack_874 = (ushort)bStack_916;
    uStack_872 = (ushort)bStack_915;
    uStack_870 = (ushort)bStack_914;
    uStack_86e = (ushort)bStack_913;
    uStack_86c = (ushort)bStack_912;
    uStack_86a = (ushort)bStack_911;
    uStack_896 = (ushort)bStack_937;
    uStack_894 = (ushort)bStack_936;
    uStack_892 = (ushort)bStack_935;
    uStack_88e = (ushort)bStack_933;
    uStack_88c = (ushort)bStack_932;
    uStack_88a = (ushort)bStack_931;
    uVar22 = (ushort)((ushort)local_1098 + sVar18) >> 2;
    uVar28 = (ushort)(uStack_876 + sVar18) >> 2;
    uVar30 = (ushort)(uStack_874 + sVar18) >> 2;
    uVar36 = (ushort)(uStack_872 + sVar18) >> 2;
    uVar31 = (ushort)(uStack_870 + sVar18) >> 2;
    uVar34 = (ushort)(uStack_86e + sVar18) >> 2;
    uVar37 = (ushort)(uStack_86c + sVar18) >> 2;
    uVar40 = (ushort)(uStack_86a + sVar18) >> 2;
    uVar27 = (ushort)(local_1088 + sVar18) >> 2;
    uVar29 = (ushort)(uStack_896 + sVar18) >> 2;
    uVar33 = (ushort)(uStack_894 + sVar18) >> 2;
    uVar39 = (ushort)(uStack_892 + sVar18) >> 2;
    uVar32 = (ushort)(uStack_1080 + sVar18) >> 2;
    uVar35 = (ushort)(uStack_88e + sVar18) >> 2;
    uVar38 = (ushort)(uStack_88c + sVar18) >> 2;
    uVar41 = (ushort)(uStack_88a + sVar18) >> 2;
    local_1098._0_2_ =
         CONCAT11((uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28),
                  (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22));
    local_1098._0_3_ =
         CONCAT12((uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30),
                  (ushort)local_1098);
    local_1098._0_4_ =
         CONCAT13((uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36),
                  (undefined3)local_1098);
    local_1098._0_5_ =
         CONCAT14((uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31),
                  (undefined4)local_1098);
    local_1098._0_6_ =
         CONCAT15((uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34),
                  (undefined5)local_1098);
    local_1098._0_7_ =
         CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37),
                  (undefined6)local_1098);
    local_1098 = CONCAT17((uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40),
                          (undefined7)local_1098);
    uStack_1090._0_1_ = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
    uStack_1090._1_1_ = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
    uStack_1090._2_1_ = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
    uStack_1090._3_1_ = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
    uStack_1090._4_1_ = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
    uStack_1090._5_1_ = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
    uStack_1090._6_1_ = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
    uStack_1090._7_1_ = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
    *in_RDX = local_1098;
    in_RDX[1] = uStack_1090;
    local_fe4 = (undefined1)iVar20;
    local_d0._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    local_d8._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    uVar1 = CONCAT17(local_fe4,
                     CONCAT16(local_fe4,
                              CONCAT15(local_fe4,
                                       CONCAT14(local_fe4,CONCAT13(local_fe4,local_d8._0_3_)))));
    uVar8 = CONCAT17(local_fe4,
                     CONCAT16(local_fe4,
                              CONCAT15(local_fe4,
                                       CONCAT14(local_fe4,CONCAT13(local_fe4,local_d0._0_3_)))));
    local_b0._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    local_b8._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    uVar7 = CONCAT17(local_fe4,
                     CONCAT16(local_fe4,
                              CONCAT15(local_fe4,
                                       CONCAT14(local_fe4,CONCAT13(local_fe4,local_b8._0_3_)))));
    uVar9 = CONCAT17(local_fe4,
                     CONCAT16(local_fe4,
                              CONCAT15(local_fe4,
                                       CONCAT14(local_fe4,CONCAT13(local_fe4,local_b0._0_3_)))));
    local_90._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    local_98._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    uVar2 = CONCAT17(local_fe4,
                     CONCAT16(local_fe4,
                              CONCAT15(local_fe4,
                                       CONCAT14(local_fe4,CONCAT13(local_fe4,local_98._0_3_)))));
    uVar10 = CONCAT17(local_fe4,
                      CONCAT16(local_fe4,
                               CONCAT15(local_fe4,
                                        CONCAT14(local_fe4,CONCAT13(local_fe4,local_90._0_3_)))));
    local_70._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    local_78._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    uVar3 = CONCAT17(local_fe4,
                     CONCAT16(local_fe4,
                              CONCAT15(local_fe4,
                                       CONCAT14(local_fe4,CONCAT13(local_fe4,local_78._0_3_)))));
    uVar11 = CONCAT17(local_fe4,
                      CONCAT16(local_fe4,
                               CONCAT15(local_fe4,
                                        CONCAT14(local_fe4,CONCAT13(local_fe4,local_70._0_3_)))));
    sm1[0]._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    temp2._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    uVar4 = CONCAT17(local_fe4,
                     CONCAT16(local_fe4,
                              CONCAT15(local_fe4,
                                       CONCAT14(local_fe4,CONCAT13(local_fe4,(undefined3)temp2)))));
    uVar12 = CONCAT17(local_fe4,
                      CONCAT16(local_fe4,
                               CONCAT15(local_fe4,
                                        CONCAT14(local_fe4,CONCAT13(local_fe4,(undefined3)sm1[0]))))
                     );
    temp[0]._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    local_38._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    uVar5 = CONCAT17(local_fe4,
                     CONCAT16(local_fe4,
                              CONCAT15(local_fe4,
                                       CONCAT14(local_fe4,CONCAT13(local_fe4,local_38._0_3_)))));
    uVar13 = CONCAT17(local_fe4,
                      CONCAT16(local_fe4,
                               CONCAT15(local_fe4,
                                        CONCAT14(local_fe4,CONCAT13(local_fe4,(undefined3)temp[0])))
                              ));
    m_zero[1]._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    m_zero[0]._0_3_ = CONCAT21(CONCAT11(local_fe4,local_fe4),local_fe4);
    uVar6 = CONCAT17(local_fe4,
                     CONCAT16(local_fe4,
                              CONCAT15(local_fe4,
                                       CONCAT14(local_fe4,CONCAT13(local_fe4,(undefined3)m_zero[0]))
                                      )));
    uVar14 = CONCAT17(local_fe4,
                      CONCAT16(local_fe4,
                               CONCAT15(local_fe4,
                                        CONCAT14(local_fe4,CONCAT13(local_fe4,(undefined3)m_zero[1])
                                                ))));
    for (local_ff0 = 1; local_ff0 < in_R8D; local_ff0 = local_ff0 + 8) {
      *(undefined8 *)((long)in_RDX + (long)in_ECX) = uVar1;
      ((undefined8 *)((long)in_RDX + (long)in_ECX))[1] = uVar8;
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX << 1));
      *puVar21 = uVar7;
      puVar21[1] = uVar9;
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 3));
      *puVar21 = uVar2;
      puVar21[1] = uVar10;
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX << 2));
      *puVar21 = uVar3;
      puVar21[1] = uVar11;
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 5));
      *puVar21 = uVar4;
      puVar21[1] = uVar12;
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 6));
      *puVar21 = uVar5;
      puVar21[1] = uVar13;
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 7));
      *puVar21 = uVar6;
      puVar21[1] = uVar14;
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX << 3));
      *puVar21 = uVar1;
      puVar21[1] = uVar8;
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 9));
      *puVar21 = uVar7;
      puVar21[1] = uVar9;
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 10));
      *puVar21 = uVar2;
      puVar21[1] = uVar10;
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 0xb));
      *puVar21 = uVar3;
      puVar21[1] = uVar11;
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 0xc));
      *puVar21 = uVar4;
      puVar21[1] = uVar12;
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 0xd));
      *puVar21 = uVar5;
      puVar21[1] = uVar13;
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 0xe));
      *puVar21 = uVar6;
      puVar21[1] = uVar14;
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 0xf));
      *puVar21 = uVar1;
      puVar21[1] = uVar8;
    }
    *(char *)in_RDX =
         (char)((int)((uint)*(byte *)(in_RDI + (iVar19 + -1)) + iVar20 * 2 +
                      (uint)*(byte *)(in_RDI + (iVar19 + 1)) + 2) >> 2);
    for (local_ff0 = 1; local_ff0 < in_R8D; local_ff0 = local_ff0 + 1) {
      *(char *)((long)in_RDX + (long)(local_ff0 * in_ECX)) =
           (char)((int)((uint)*(byte *)(in_RDI + ((iVar19 + -1) - local_ff0)) + iVar20 * 3 + 2) >> 2
                 );
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_dc_ssse3(UWORD8 *pu1_ref,
                                    WORD32 src_strd,
                                    UWORD8 *pu1_dst,
                                    WORD32 dst_strd,
                                    WORD32 nt,
                                    WORD32 mode)
{

    WORD32 acc_dc;
    WORD32 dc_val, two_dc_val, three_dc_val;
    WORD32 row;
    WORD32 log2nt = 5;
    WORD32 two_nt, three_nt;
    __m128i src_temp1, src_temp7, src_temp3, src_temp4, src_temp5, src_temp6;
    __m128i src_temp8, src_temp10, src_temp2;
    __m128i m_zero = _mm_setzero_si128();
    __m128i sm = _mm_load_si128((__m128i *)&IHEVCE_SHUFFLEMASK5[0]);
    UNUSED(src_strd);
    UNUSED(mode);


    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }
    two_nt = 2 * nt;
    three_nt = 3 * nt;

    acc_dc = 0;
    /* Calculate DC value for the transform block */



    if(nt == 32)
    {
        __m128i temp;
        WORD32 itr_count;

        src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
        src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 16));
        src_temp7 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 32));
        src_temp8 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 48));

        src_temp3 = _mm_sad_epu8(src_temp3, m_zero);
        src_temp4 = _mm_sad_epu8(src_temp4, m_zero);
        src_temp7 = _mm_sad_epu8(src_temp7, m_zero);
        src_temp8 = _mm_sad_epu8(src_temp8, m_zero);

        src_temp4 = _mm_add_epi16(src_temp3, src_temp4);
        src_temp8 = _mm_add_epi16(src_temp7, src_temp8);
        src_temp4 = _mm_add_epi16(src_temp4, src_temp8);

        src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

        acc_dc = _mm_cvtsi128_si32(src_temp4);

        acc_dc += pu1_ref[three_nt];
        acc_dc -= pu1_ref[two_nt];

        /* computing acc_dc value */
        dc_val = (acc_dc + nt) >> (log2nt + 1);

        two_dc_val = 2 * dc_val;
        three_dc_val = 3 * dc_val;

        temp = _mm_set1_epi8(dc_val);

        for(itr_count = 0; itr_count < 2; itr_count++)
        {
            /*  pu1_dst[(row * dst_strd) + col] = dc_val;*/
            _mm_storeu_si128((__m128i *)(pu1_dst + ((0) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), temp);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), temp);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((0) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((1) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((2) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((3) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((4) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((5) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((6) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((7) * dst_strd)), temp);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((8) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((9) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((10) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((11) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((12) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((13) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((14) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((15) * dst_strd)), temp);

            pu1_dst += 16 * dst_strd;
        }
    }
    else

    {
        __m128i sm1 = _mm_load_si128((__m128i *)&IHEVCE_SHUFFLEMASK4[0]);

        /* DC filtering for the first top row and first left column */



        if(nt == 4) /* nt multiple of 4*/
        {
            WORD32 temp1, temp2, temp3;

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
            src_temp2 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

            src_temp4 =  _mm_unpacklo_epi8(src_temp3, m_zero);
            src_temp2 =  _mm_unpacklo_epi8(src_temp2, m_zero);

            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);
            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

/* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;

            /* loding 8-bit 16 pixel */
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2) >> 2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);

            src_temp2 = _mm_packus_epi16(src_temp2, m_zero);

            temp1 = _mm_cvtsi128_si32(src_temp2);

            *(WORD32 *)(&pu1_dst[0]) = temp1;

            src_temp2 = _mm_insert_epi16(src_temp2, dc_val, 0);

            src_temp2 =  _mm_shuffle_epi8(src_temp2, sm1);
            src_temp3 =  _mm_shuffle_epi8(src_temp2, sm1);
            src_temp4 =  _mm_shuffle_epi8(src_temp2, sm1);

            temp1 = _mm_cvtsi128_si32(src_temp2);
            temp2 = _mm_cvtsi128_si32(src_temp3);
            temp3 = _mm_cvtsi128_si32(src_temp4);

            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp2;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp3;

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;

        }
        else if(nt == 8) /* if nt%8==0*/
        {

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));

            src_temp4 = _mm_sad_epu8(src_temp3, m_zero);
            src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);

            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

            /* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /* loding 8-bit 16 pixel */
            src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp2 =  _mm_unpacklo_epi8(src_temp2, m_zero);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2)>>2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);
            src_temp2 = _mm_packus_epi16(src_temp2, m_zero);

            _mm_storel_epi64((__m128i *)(pu1_dst), src_temp2);

            /* Fill the remaining rows with DC value*/

            src_temp1 = _mm_set1_epi8(dc_val);
            src_temp2 = _mm_set1_epi8(dc_val);
            src_temp3 = _mm_set1_epi8(dc_val);
            src_temp4 = _mm_set1_epi8(dc_val);
            src_temp5 = _mm_set1_epi8(dc_val);
            src_temp6 = _mm_set1_epi8(dc_val);
            src_temp7 = _mm_set1_epi8(dc_val);

            _mm_storel_epi64((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;

        }
        else /* if nt == 16*/
        {

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
            src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 16));

            src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp10 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 8));

            src_temp3 = _mm_sad_epu8(src_temp3, m_zero);
            src_temp4 = _mm_sad_epu8(src_temp4, m_zero);

            src_temp2  =  _mm_unpacklo_epi8(src_temp2, m_zero);
            src_temp10 =  _mm_unpacklo_epi8(src_temp10, m_zero);

            src_temp4 = _mm_add_epi16(src_temp3, src_temp4);
            src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);

            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

            /* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);
            src_temp10 = _mm_add_epi16(src_temp10, src_temp1);
            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2)>>2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);
            src_temp10 = _mm_srli_epi16(src_temp10, 2);

            src_temp2 = _mm_packus_epi16(src_temp2, src_temp10);

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp2);

            /* Fill the remaining rows with DC value*/
            src_temp1 =  _mm_set1_epi8(dc_val);
            src_temp2 =  _mm_set1_epi8(dc_val);
            src_temp3 =  _mm_set1_epi8(dc_val);
            src_temp4 =  _mm_set1_epi8(dc_val);
            src_temp5 =  _mm_set1_epi8(dc_val);
            src_temp6 =  _mm_set1_epi8(dc_val);
            src_temp7 =  _mm_set1_epi8(dc_val);

            for(row = 1; row < nt; row += 8)
            {

                _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), src_temp3);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), src_temp7);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), src_temp1);

            }

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;

        }
    }
}